

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
CanSimulationDataGenerator::CreateDataOrRemoteFrame
          (CanSimulationDataGenerator *this,U32 identifier,bool use_extended_frame_format,
          bool remote_frame,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
          bool get_ack_in_response)

{
  byte bVar1;
  pointer pBVar2;
  vector<BitState,_std::allocator<BitState>_> *this_00;
  vector<BitState,std::allocator<BitState>> *this_01;
  undefined7 in_register_00000009;
  vector<BitState,_std::allocator<BitState>_> *pvVar3;
  undefined3 in_register_00000089;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  BitState local_6c;
  undefined1 *local_68;
  vector<BitState,_std::allocator<BitState>_> *local_60;
  undefined4 local_54;
  vector<BitState,_std::allocator<BitState>_> *local_50;
  vector<BitState,_std::allocator<BitState>_> *local_48;
  vector<BitState,std::allocator<BitState>> *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_54 = CONCAT31(in_register_00000089,get_ack_in_response);
  local_68 = (undefined1 *)CONCAT44(local_68._4_4_,(int)CONCAT71(in_register_00000009,remote_frame))
  ;
  pBVar2 = (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeFixedFormBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mFakeFixedFormBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeFixedFormBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
      .super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeCrcFieldWithoutDelimiter).
           super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->mFakeCrcFieldWithoutDelimiter).super__Vector_base<BitState,_std::allocator<BitState>_>.
      _M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeCrcFieldWithoutDelimiter).super__Vector_base<BitState,_std::allocator<BitState>_>.
    _M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeAckField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mFakeAckField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeAckField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pBVar2 = (this->mFakeEndOfFrame).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mFakeEndOfFrame).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    (this->mFakeEndOfFrame).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
  }
  pvVar3 = &this->mFakeArbitrationField;
  local_60 = &this->mFakeControlField;
  local_38 = data;
  local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
  std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
            (&this->mFakeStartOfFrameField,&local_6c);
  if (use_extended_frame_format) {
    uVar6 = 0x10000000;
    iVar4 = 0xb;
    while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
      if ((uVar6 & identifier) == 0) {
        local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
      }
      else {
        local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
      }
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
      uVar6 = uVar6 >> 1;
    }
    local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
    local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
    uVar6 = 0x20000;
    iVar4 = 0x12;
    while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
      if ((uVar6 & identifier) == 0) {
        local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
      }
      else {
        local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
      }
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
      uVar6 = uVar6 >> 1;
    }
    if ((char)local_68 == '\0') {
      local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
    }
    else {
      local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    }
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
    local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    pvVar3 = local_60;
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(local_60,&local_6c);
    local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
  }
  else {
    iVar4 = 0xb;
    uVar6 = 0x400;
    while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
      if ((uVar6 & identifier) == 0) {
        local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
      }
      else {
        local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
      }
      std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
      uVar6 = uVar6 >> 1;
    }
    if ((char)local_68 == '\0') {
      local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
    }
    else {
      local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    }
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
    local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
    pvVar3 = local_60;
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(local_60,&local_6c);
    local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
  }
  std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
  uVar7 = (long)(local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)uVar7;
  if (9 < uVar6) {
    AnalyzerHelpers::Assert("can\'t sent more than 8 bytes");
  }
  if ((char)local_68 == '\x01' && uVar6 != 0) {
    AnalyzerHelpers::Assert("remote frames can\'t send data");
  }
  local_40 = (vector<BitState,std::allocator<BitState>> *)&this->mFakeFixedFormBits;
  local_50 = &this->mFakeAckField;
  local_48 = &this->mFakeEndOfFrame;
  uVar5 = 8;
  iVar4 = 4;
  while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
    if ((uVar5 & uVar6) == 0) {
      local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
    }
    else {
      local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    }
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(local_60,&local_6c);
    uVar5 = uVar5 >> 1;
  }
  if ((char)local_68 == '\0') {
    local_68 = (undefined1 *)(uVar7 & 0xffffffff);
    pvVar3 = (vector<BitState,_std::allocator<BitState>_> *)0x0;
    while (pvVar3 != (vector<BitState,_std::allocator<BitState>_> *)local_68) {
      bVar1 = *(byte *)((long)&(pvVar3->super__Vector_base<BitState,_std::allocator<BitState>_>).
                               _M_impl.super__Vector_impl_data._M_start +
                       (long)(local_38->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
      uVar6 = 0x80;
      iVar4 = 8;
      local_60 = pvVar3;
      while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
        if ((uVar6 & bVar1) == 0) {
          local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
        }
        else {
          local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
        }
        std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
                  (&this->mFakeDataField,&local_6c);
        uVar6 = uVar6 >> 1;
      }
      pvVar3 = (vector<BitState,_std::allocator<BitState>_> *)
               ((long)&(local_60->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
    }
  }
  AddCrc(this);
  if ((char)local_54 == '\0') {
    local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
  }
  else {
    local_6c = CanAnalyzerSettings::Dominant(this->mSettings);
  }
  pvVar3 = local_50;
  std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(local_50,&local_6c);
  this_01 = local_40;
  this_00 = local_48;
  local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
  std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(pvVar3,&local_6c);
  iVar4 = 7;
  while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
    local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>(this_00,&local_6c);
  }
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            (this_01,(const_iterator)
                     (this->mFakeFixedFormBits).
                     super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                     super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeAckField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeAckField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            (this_01,(const_iterator)
                     (this->mFakeFixedFormBits).
                     super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                     super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeEndOfFrame).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
             .super__Vector_impl_data._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeEndOfFrame).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
             .super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void CanSimulationDataGenerator::CreateDataOrRemoteFrame( U32 identifier, bool use_extended_frame_format, bool remote_frame,
                                                          std::vector<U8>& data, bool get_ack_in_response )
{
    // A DATA FRAME is composed of seven different bit fields:
    // START OF FRAME, ARBITRATION FIELD, CONTROL FIELD, DATA FIELD, CRC
    // FIELD, ACK FIELD, END OF FRAME. The DATA FIELD can be of length zero.

    mFakeStuffedBits.clear();
    mFakeFixedFormBits.clear();
    mFakeStartOfFrameField.clear();
    mFakeArbitrationField.clear();
    mFakeControlField.clear();
    mFakeDataField.clear();
    mFakeCrcFieldWithoutDelimiter.clear();
    mFakeAckField.clear();
    mFakeEndOfFrame.clear();

    // START OF FRAME (Standard Format as well as Extended Format)
    // The START OF FRAME (SOF) marks the beginning of DATA FRAMES and REMOTE
    // FRAMEs. It consists of a single dominant bit.
    // A station is only allowed to start transmission when the bus is idle (see INTERFRAME
    // Spacing). All stations have to synchronize to the leading edge caused by START OF
    // FRAME (see HARD SYNCHRONIZATION) of the station starting transmission first.

    mFakeStartOfFrameField.push_back( mSettings->Dominant() );

    // ARBITRATION FIELD
    // The format of the ARBITRATION FIELD is different for Standard Format and
    // Extended Format Frames.

    // In Standard Format the ARBITRATION FIELD consists of the 11 bit IDENTIFIER
    // and the RTR-BIT. The IDENTIFIER bits are denoted ID-28 ... ID-18.

    // In Extended Format the ARBITRATION FIELD consists of the 29 bit IDENTIFIER,
    // the SRR-Bit, the IDE-Bit, and the RTR-BIT. The IDENTIFIER bits are denoted ID-28
    //... ID-0.

    if( use_extended_frame_format == true )
    {
        U32 mask = 1 << 28; // 28 bits in exdended format's identifier.

        // IDENTIFIER - Extended Format
        // In contrast to the Standard Format the Extended Format consists of 29 bits. The
        // format comprises two sections:

        // Base ID
        // The Base ID consists of 11 bits. It is transmitted in the order from ID-28 to ID-18. It
        // is equivalent to format of the Standard Identifier. The Base ID defines the Extended
        // Frames base priority.

        // Extended ID
        // The Extended ID consists of 18 bits. It is transmitted in the order of ID-17 to ID-0.

        // 11 bits of identifier:
        for( U32 i = 0; i < 11; i++ )
        {
            if( ( mask & identifier ) == 0 )
                mFakeArbitrationField.push_back( mSettings->Dominant() );
            else
                mFakeArbitrationField.push_back( mSettings->Recessive() );

            mask >>= 1;
        }

        // the next bit is SRR
        // SRR BIT (Extended Format)
        // Substitute Remote Request BIT
        // The SRR is a recessive bit. It is transmitted in Extended Frames at the position of the
        // RTR bit in Standard Frames and so substitutes the RTR-Bit in the Standard Frame.
        // Therefore, collisions of a Standard Frame and an Extended Frame, the Base ID (see
        // Extended IDENTIFIER below) of which is the same as the Standard Frames Identifier,
        // are resolved in such a way that the Standard Frame prevails the Extended Frame.

        mFakeArbitrationField.push_back( mSettings->Recessive() ); // SSR bit

        // the next bit is IDE
        // IDE BIT (Extended Format)
        // Identifier Extension Bit
        // The IDE Bit belongs to
        //- the ARBITRATION FIELD for the Extended Format
        //- the Control Field for the Standard Format
        // The IDE bit in the Standard Format is transmitted dominant, whereas in the Extended
        // Format the IDE bit is recessive.

        mFakeArbitrationField.push_back( mSettings->Recessive() ); // IDE bit

        // 18 bits of identifier:
        for( U32 i = 0; i < 18; i++ )
        {
            if( ( mask & identifier ) == 0 )
                mFakeArbitrationField.push_back( mSettings->Dominant() );
            else
                mFakeArbitrationField.push_back( mSettings->Recessive() );

            mask >>= 1;
        }

        // the next bit is RTR
        // RTR BIT (Standard Format as well as Extended Format)
        // Remote Transmission Request BIT
        // In DATA FRAMEs the RTR BIT has to be dominant. Within a REMOTE FRAME the
        // RTR BIT has to be recessive.

        if( remote_frame == true )
            mFakeArbitrationField.push_back( mSettings->Recessive() ); // RTR bit
        else
            mFakeArbitrationField.push_back( mSettings->Dominant() ); // RTR bit


        // next is the control field.  r1, r0, DLC3, DLC2, DLC1, DLC0

        // CONTROL FIELD (Standard Format as well as Extended Format)
        // The CONTROL FIELD consists of six bits. The format of the CONTROL FIELD is
        // different for Standard Format and Extended Format. Frames in Standard Format
        // include the DATA LENGTH CODE, the IDE bit, which is transmitted dominant (see
        // above), and the reserved bit r0. Frames in the Extended Format include the DATA
        // LENGTH CODE and two reserved bits r1 and r0. The reserved bits have to be sent
        // dominant, but receivers accept dominant and recessive bits in all combinations.

        mFakeControlField.push_back( mSettings->Recessive() ); // r1 bit
        mFakeControlField.push_back( mSettings->Recessive() ); // r0 bit
    }
    else
    {
        // IDENTIFIER
        // IDENTIFIER - Standard Format
        // The IDENTIFIERs length is 11 bits and corresponds to the Base ID in Extended
        // Format. These bits are transmitted in the order from ID-28 to ID-18. The least
        // significant bit is ID-18. The 7 most significant bits (ID-28 - ID-22) must not be all
        // recessive.

        // In a Standard Frame the IDENTIFIER is followed by the RTR bit.
        // RTR BIT (Standard Format as well as Extended Format)
        // Remote Transmission Request BIT
        // In DATA FRAMEs the RTR BIT has to be dominant. Within a REMOTE FRAME the
        // RTR BIT has to be recessive.


        U32 mask = 1 << 10;
        for( U32 i = 0; i < 11; i++ )
        {
            if( ( mask & identifier ) == 0 )
                mFakeArbitrationField.push_back( mSettings->Dominant() );
            else
                mFakeArbitrationField.push_back( mSettings->Recessive() );

            mask >>= 1;
        }

        // the next bit is RTR
        // RTR BIT (Standard Format as well as Extended Format)
        // Remote Transmission Request BIT
        // In DATA FRAMEs the RTR BIT has to be dominant. Within a REMOTE FRAME the
        // RTR BIT has to be recessive.

        if( remote_frame == true )
            mFakeArbitrationField.push_back( mSettings->Recessive() ); // RTR bit
        else
            mFakeArbitrationField.push_back( mSettings->Dominant() ); // RTR bit

        // next is the control field.  r1, r0, DLC3, DLC2, DLC1, DLC0

        // CONTROL FIELD (Standard Format as well as Extended Format)
        // The CONTROL FIELD consists of six bits. The format of the CONTROL FIELD is
        // different for Standard Format and Extended Format. Frames in Standard Format
        // include the DATA LENGTH CODE, the IDE bit, which is transmitted dominant (see
        // above), and the reserved bit r0. Frames in the Extended Format include the DATA
        // LENGTH CODE and two reserved bits r1 and r0. The reserved bits have to be sent
        // dominant, but receivers accept dominant and recessive bits in all combinations.

        mFakeControlField.push_back( mSettings->Dominant() ); // IDE bit
        mFakeControlField.push_back( mSettings->Dominant() ); // r0 bit
    }


    // send 4 bits for the length of the attached data.
    U32 data_size = data.size();
    if( data_size > 9 )
        AnalyzerHelpers::Assert( "can't sent more than 8 bytes" );

    if( remote_frame == true )
        if( data_size != 0 )
            AnalyzerHelpers::Assert( "remote frames can't send data" );

    U32 mask = 1 << 3;
    for( U32 i = 0; i < 4; i++ )
    {
        if( ( mask & data_size ) == 0 )
            mFakeControlField.push_back( mSettings->Dominant() );
        else
            mFakeControlField.push_back( mSettings->Recessive() );

        mask >>= 1;
    }

    // next is the DATA FIELD
    // DATA FIELD (Standard Format as well as Extended Format)
    // The DATA FIELD consists of the data to be transferred within a DATA FRAME. It can
    // contain from 0 to 8 bytes, which each contain 8 bits which are transferred MSB first.

    if( remote_frame == false )
    {
        for( U32 i = 0; i < data_size; i++ )
        {
            U32 dat = data[ i ];
            U32 mask = 0x80;

            for( U32 j = 0; j < 8; j++ )
            {
                if( ( mask & dat ) == 0 )
                    mFakeDataField.push_back( mSettings->Dominant() );
                else
                    mFakeDataField.push_back( mSettings->Recessive() );

                mask >>= 1;
            }
        }
    }

    // CRC FIELD (Standard Format as well as Extended Format)
    // contains the CRC SEQUENCE followed by a CRC DELIMITER.

    AddCrc();


    // ACK FIELD (Standard Format as well as Extended Format)
    // The ACK FIELD is two bits long and contains the ACK SLOT and the ACK DELIMITER.
    // In the ACK FIELD the transmitting station sends two recessive bits.
    // A RECEIVER which has received a valid message correctly, reports this to the
    // TRANSMITTER by sending a dominant bit during the ACK SLOT (it sends ACK).

    // ACK SLOT
    // All stations having received the matching CRC SEQUENCE report this within the ACK
    // SLOT by superscribing the recessive bit of the TRANSMITTER by a dominant bit.

    if( get_ack_in_response == true )
        mFakeAckField.push_back( mSettings->Dominant() );
    else
        mFakeAckField.push_back( mSettings->Recessive() );

    // ACK DELIMITER
    // The ACK DELIMITER is the second bit of the ACK FIELD and has to be a recessive
    // bit. As a consequence, the ACK SLOT is surrounded by two recessive bits (CRC
    // DELIMITER, ACK DELIMITER).

    mFakeAckField.push_back( mSettings->Recessive() );

    // END OF FRAME (Standard Format as well as Extended Format)
    // Each DATA FRAME and REMOTE FRAME is delimited by a flag sequence consisting
    // of seven recessive bits.

    for( U32 i = 0; i < 7; i++ )
        mFakeEndOfFrame.push_back( mSettings->Recessive() );


    mFakeFixedFormBits.insert( mFakeFixedFormBits.end(), mFakeAckField.begin(), mFakeAckField.end() );
    mFakeFixedFormBits.insert( mFakeFixedFormBits.end(), mFakeEndOfFrame.begin(), mFakeEndOfFrame.end() );
}